

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O2

void __thiscall WriteIncludesBase::acceptLayout(WriteIncludesBase *this,DomLayout *node)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (node->m_attr_class).d.d;
  local_38.ptr = (node->m_attr_class).d.ptr;
  local_38.size = (node->m_attr_class).d.size;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  add(this,(QString *)&local_38,(DomCustomWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  this->m_laidOut = true;
  TreeWalker::acceptLayout(&this->super_TreeWalker,node);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptLayout(DomLayout *node)
{
    add(node->attributeClass());
    m_laidOut = true;
    TreeWalker::acceptLayout(node);
}